

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O2

void __thiscall CastMessage::reset(CastMessage *this)

{
  this->_protocol_version = 0;
  (this->_source_id)._M_string_length = 0;
  *(this->_source_id)._M_dataplus._M_p = '\0';
  (this->_destination_id)._M_string_length = 0;
  *(this->_destination_id)._M_dataplus._M_p = '\0';
  (this->_namespace)._M_string_length = 0;
  *(this->_namespace)._M_dataplus._M_p = '\0';
  this->_payload_type = 0;
  (this->_payload_utf8)._M_string_length = 0;
  *(this->_payload_utf8)._M_dataplus._M_p = '\0';
  (this->_payload_binary)._M_string_length = 0;
  *(this->_payload_binary)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void reset() override {
        _protocol_version = CASTV2_1_0;
        _source_id.clear();
        _destination_id.clear();
        _namespace.clear();
        _payload_type = STRING;
        _payload_utf8.clear();
        _payload_binary.clear();
    }